

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError parse_args(GlobalConfig *global,int argc,char **argv)

{
  GlobalConfig *pGVar1;
  ParameterError error;
  OperationConfig *pOVar2;
  char *pcVar3;
  uint uVar4;
  byte *nextarg;
  undefined4 in_register_00000034;
  undefined8 uVar5;
  int iVar6;
  OperationConfig *config;
  ParameterError PVar8;
  bool bVar9;
  _Bool passarg;
  _Bool used;
  _Bool local_4a;
  _Bool local_49;
  undefined8 local_48;
  GlobalConfig *local_40;
  int local_34;
  int iVar7;
  
  uVar5 = CONCAT44(in_register_00000034,argc);
  config = global->first;
  local_40 = global;
  if (argc < 2) {
    nextarg = (byte *)0x0;
LAB_00113159:
    if ((config->field_0x4ec & 1) == 0) {
      return PARAM_OK;
    }
    if ((config->field_0x4e4 & 0x20) == 0) {
      return PARAM_OK;
    }
    PVar8 = PARAM_CONTDISP_RESUME_FROM;
    pcVar3 = param2text(PARAM_CONTDISP_RESUME_FROM);
    error = PARAM_CONTDISP_RESUME_FROM;
    if (nextarg == (byte *)0x0) goto LAB_001131db;
  }
  else {
    local_34 = argc + -1;
    iVar6 = 1;
    bVar9 = true;
    local_48 = uVar5;
    do {
      pGVar1 = local_40;
      nextarg = (byte *)argv[iVar6];
      if (nextarg == (byte *)0x0) {
        return PARAM_NO_MEM;
      }
      iVar7 = iVar6;
      if ((bVar9) && (*nextarg == 0x2d)) {
        uVar4 = nextarg[1] - 0x2d;
        if (uVar4 == 0) {
          uVar4 = (uint)nextarg[2];
        }
        PVar8 = PARAM_OK;
        bVar9 = uVar4 != 0;
        error = PARAM_OK;
        if (bVar9) {
          if (iVar6 < local_34) {
            pcVar3 = argv[(long)iVar6 + 1];
            if (pcVar3 == (char *)0x0) {
              return PARAM_NO_MEM;
            }
          }
          else {
            pcVar3 = (char *)0x0;
          }
          error = getparameter((char *)nextarg,pcVar3,(char *)nextarg,argv[(long)iVar6 + 1],
                               &local_4a,local_40,config);
          config = pGVar1->last;
          uVar5 = local_48;
          if (error == PARAM_OK) {
            iVar7 = iVar6 + 1;
            error = PVar8;
            if (local_4a == false) {
              iVar7 = iVar6;
            }
          }
          else if (error == PARAM_NEXT_OPERATION) {
            if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0)) {
              errorf(local_40,"missing URL before --next");
              uVar5 = local_48;
              error = PARAM_BAD_USE;
            }
            else {
              pOVar2 = (OperationConfig *)malloc(0x4f0);
              config->next = pOVar2;
              if (pOVar2 == (OperationConfig *)0x0) {
                uVar5 = local_48;
                error = PARAM_NO_MEM;
              }
              else {
                config_init(pOVar2);
                pOVar2 = config->next;
                pOVar2->global = local_40;
                local_40->last = pOVar2;
                pOVar2->prev = config;
                uVar5 = local_48;
                config = pOVar2;
                error = PVar8;
              }
            }
          }
        }
      }
      else {
        error = getparameter("--url",(char *)nextarg,(char *)0x0,(char *)0x0,&local_49,local_40,
                             config);
        uVar5 = local_48;
      }
      iVar6 = iVar7 + 1;
    } while ((iVar6 < (int)uVar5) && (error == PARAM_OK));
    if (error == PARAM_OK) goto LAB_00113159;
    if (error - PARAM_HELP_REQUESTED < 5) {
      return error;
    }
    pcVar3 = param2text(error);
  }
  PVar8 = error;
  uVar4 = *nextarg - 0x3a;
  if (uVar4 == 0) {
    uVar4 = (uint)nextarg[1];
  }
  if (uVar4 != 0) {
    helpf(tool_stderr,"option %s: %s",nextarg,pcVar3);
    return PVar8;
  }
LAB_001131db:
  helpf(tool_stderr,"%s",pcVar3);
  return PVar8;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *global, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  const char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *config = global->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = convert_tchar_to_UTF8(argv[i]);
    if(!orig_opt)
      return PARAM_NO_MEM;

    if(stillflags && ('-' == orig_opt[0])) {
      bool passarg;

      if(!strcmp("--", orig_opt))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        const char *nextarg = NULL;
        if(i < (argc - 1)) {
          nextarg = convert_tchar_to_UTF8(argv[i + 1]);
          if(!nextarg) {
            unicodefree(orig_opt);
            return PARAM_NO_MEM;
          }
        }

        result = getparameter(orig_opt, nextarg, argv[i], argv[i + 1],
                              &passarg, global, config);

        unicodefree(nextarg);
        config = global->last;
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(config->url_list && config->url_list->url) {
            /* Allocate the next config */
            config->next = malloc(sizeof(struct OperationConfig));
            if(config->next) {
              /* Initialise the newly created config */
              config_init(config->next);

              /* Set the global config pointer */
              config->next->global = global;

              /* Update the last config pointer */
              global->last = config->next;

              /* Move onto the new config */
              config->next->prev = config;
              config = config->next;
            }
            else
              result = PARAM_NO_MEM;
          }
          else {
            errorf(global, "missing URL before --next");
            result = PARAM_BAD_USE;
          }
        }
        else if(!result && passarg)
          i++; /* we are supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter("--url", orig_opt, NULL, NULL,
                            &used, global, config);
    }

    if(!result)
      unicodefree(orig_opt);
  }

  if(!result && config->content_disposition) {
    if(config->resume_from_current)
      result = PARAM_CONTDISP_RESUME_FROM;
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED &&
     result != PARAM_CA_EMBED_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(tool_stderr, "option %s: %s", orig_opt, reason);
    else
      helpf(tool_stderr, "%s", reason);
  }

  unicodefree(orig_opt);
  return result;
}